

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFMovem<(moira::Instr)193,(moira::Mode)6,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  u32 *puVar3;
  bool bVar4;
  StrWriter *pSVar5;
  Ea<(moira::Mode)6,_4> local_220;
  Dn local_208;
  int local_204;
  Ffmt local_200 [2];
  Ea<(moira::Mode)6,_4> local_1f8;
  Imd local_1e0;
  FRegList local_1da;
  int local_1d8;
  Ffmt local_1d4 [2];
  Ea<(moira::Mode)6,_4> local_1cc;
  Dn local_1b4;
  int local_1b0;
  Ffmt local_1ac [2];
  Ea<(moira::Mode)6,_4> local_1a4;
  Imd local_18c;
  FRegList local_186;
  int local_184;
  Ffmt local_180 [2];
  Dn local_178 [2];
  Ea<(moira::Mode)6,_4> local_170;
  int local_15c;
  Ffmt local_158 [2];
  Imd local_150;
  FRegList local_14c [2];
  Ea<(moira::Mode)6,_4> local_148;
  int local_134;
  Ffmt local_130 [2];
  Dn local_128 [2];
  Ea<(moira::Mode)6,_4> local_120;
  int local_10c;
  Ffmt local_108 [2];
  Imd local_100;
  FRegList local_fc [2];
  Ea<(moira::Mode)6,_4> local_f8;
  int local_e4;
  Ffmt local_e0 [2];
  Ea<(moira::Mode)6,_4> local_d8;
  Fctrl local_c0;
  int local_bc;
  Ffmt local_b8 [2];
  int local_b0;
  Ffmt local_ac [2];
  Ea<(moira::Mode)6,_4> local_a4;
  int local_8c;
  Ffmt local_88 [2];
  Fctrl local_80 [2];
  Ea<(moira::Mode)6,_4> local_78;
  int local_64;
  Ffmt local_60 [2];
  int local_58;
  Ffmt local_54 [2];
  Ea<(moira::Mode)6,_4> local_4c;
  int local_38;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  u32 uStack_2c;
  u8 lll;
  u8 rrr;
  u8 mod;
  u8 cod;
  u8 reg;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  _rrr = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  uStack_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 7;
  local_2e = (byte)(uStack_2c >> 0xd) & 7;
  local_2f = (byte)(uStack_2c >> 0xb) & 3;
  local_30 = (byte)(uStack_2c >> 4) & 7;
  local_31 = (byte)(uStack_2c >> 10) & 7;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar4 = isValidExtFPU(this,FMOVEM,IX,ext._2_2_,uStack_2c), bVar4)) {
    switch(local_2e) {
    case 4:
      if (((uStack_2c & 0x1c00) == 0) &&
         ((**(int **)(addr_local + 0xc) == 2 || (**(int **)(addr_local + 0xc) == 3)))) {
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local,"fmovel");
        local_38 = addr_local[0xe];
        pSVar5 = StrWriter::operator<<(pSVar5,(Tab)local_38);
        Op<(moira::Mode)6,4>(&local_4c,this,(ushort)local_2d,_old);
        pSVar5 = StrWriter::operator<<(pSVar5,&local_4c);
        StrWriter::operator<<(pSVar5);
      }
      else {
        if ((((local_31 == 0) || (local_31 == 1)) || (local_31 == 2)) || (local_31 == 4)) {
          pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
          Ffmt::Ffmt(local_54,0);
          pSVar5 = StrWriter::operator<<(pSVar5,local_54[0]);
          local_58 = addr_local[0xe];
          StrWriter::operator<<(pSVar5,(Tab)local_58);
        }
        else {
          pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
          Ffmt::Ffmt(local_60,0);
          pSVar5 = StrWriter::operator<<(pSVar5,local_60[0]);
          local_64 = addr_local[0xe];
          StrWriter::operator<<(pSVar5,(Tab)local_64);
        }
        puVar3 = addr_local;
        Op<(moira::Mode)6,4>(&local_78,this,(ushort)local_2d,_old);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,&local_78);
        pSVar5 = StrWriter::operator<<(pSVar5);
        Fctrl::Fctrl(local_80,(uint)local_31);
        StrWriter::operator<<(pSVar5,local_80[0]);
      }
      break;
    case 5:
      if (((uStack_2c & 0x1c00) == 0) &&
         ((**(int **)(addr_local + 0xc) == 2 || (**(int **)(addr_local + 0xc) == 3)))) {
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_88,0);
        pSVar5 = StrWriter::operator<<(pSVar5,local_88[0]);
        local_8c = addr_local[0xe];
        pSVar5 = StrWriter::operator<<(pSVar5,(Tab)local_8c);
        pSVar5 = StrWriter::operator<<(pSVar5);
        Op<(moira::Mode)6,4>(&local_a4,this,(ushort)local_2d,_old);
        StrWriter::operator<<(pSVar5,&local_a4);
      }
      else {
        if (((local_31 == 0) || (local_31 == 1)) || ((local_31 == 2 || (local_31 == 4)))) {
          pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
          Ffmt::Ffmt(local_ac,0);
          pSVar5 = StrWriter::operator<<(pSVar5,local_ac[0]);
          local_b0 = addr_local[0xe];
          StrWriter::operator<<(pSVar5,(Tab)local_b0);
        }
        else {
          pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
          Ffmt::Ffmt(local_b8,0);
          pSVar5 = StrWriter::operator<<(pSVar5,local_b8[0]);
          local_bc = addr_local[0xe];
          StrWriter::operator<<(pSVar5,(Tab)local_bc);
        }
        puVar3 = addr_local;
        Fctrl::Fctrl(&local_c0,(uint)local_31);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,local_c0);
        pSVar5 = StrWriter::operator<<(pSVar5);
        Op<(moira::Mode)6,4>(&local_d8,this,(ushort)local_2d,_old);
        StrWriter::operator<<(pSVar5,&local_d8);
      }
      break;
    case 6:
      switch(local_2f) {
      case 0:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_e0,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_e0[0]);
        local_e4 = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_e4);
        puVar3 = addr_local;
        Op<(moira::Mode)6,4>(&local_f8,this,(ushort)local_2d,_old);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,&local_f8);
        StrWriter::operator<<(pSVar5);
        puVar3 = addr_local;
        if ((uStack_2c & 0xff) == 0) {
          Imd::Imd(&local_100,0);
          StrWriter::operator<<((StrWriter *)puVar3,local_100);
        }
        else {
          FRegList::FRegList(local_fc,(ushort)uStack_2c & 0xff);
          StrWriter::operator<<((StrWriter *)puVar3,local_fc[0]);
        }
        break;
      case 1:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_108,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_108[0]);
        local_10c = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_10c);
        puVar3 = addr_local;
        Op<(moira::Mode)6,4>(&local_120,this,(ushort)local_2d,_old);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,&local_120);
        StrWriter::operator<<(pSVar5);
        puVar3 = addr_local;
        Dn::Dn(local_128,(uint)local_30);
        StrWriter::operator<<((StrWriter *)puVar3,local_128[0]);
        break;
      case 2:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_130,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_130[0]);
        local_134 = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_134);
        puVar3 = addr_local;
        Op<(moira::Mode)6,4>(&local_148,this,(ushort)local_2d,_old);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,&local_148);
        StrWriter::operator<<(pSVar5);
        puVar3 = addr_local;
        if ((uStack_2c & 0xff) == 0) {
          Imd::Imd(&local_150,0);
          StrWriter::operator<<((StrWriter *)puVar3,local_150);
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (ulong)(uStack_2c & 0xff) * 0x202020202 & 0x10884422010;
          FRegList::FRegList(local_14c,(ushort)SUB161(auVar1 % ZEXT816(0x3ff),0));
          StrWriter::operator<<((StrWriter *)puVar3,local_14c[0]);
        }
        break;
      case 3:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_158,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_158[0]);
        local_15c = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_15c);
        puVar3 = addr_local;
        Op<(moira::Mode)6,4>(&local_170,this,(ushort)local_2d,_old);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,&local_170);
        StrWriter::operator<<(pSVar5);
        puVar3 = addr_local;
        Dn::Dn(local_178,(uint)local_30);
        StrWriter::operator<<((StrWriter *)puVar3,local_178[0]);
      }
      break;
    case 7:
      switch(local_2f) {
      case 0:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_180,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_180[0]);
        local_184 = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_184);
        puVar3 = addr_local;
        if ((uStack_2c & 0xff) == 0) {
          Imd::Imd(&local_18c,0);
          StrWriter::operator<<((StrWriter *)puVar3,local_18c);
        }
        else {
          FRegList::FRegList(&local_186,(ushort)uStack_2c & 0xff);
          StrWriter::operator<<((StrWriter *)puVar3,local_186);
        }
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Op<(moira::Mode)6,4>(&local_1a4,this,(ushort)local_2d,_old);
        StrWriter::operator<<(pSVar5,&local_1a4);
        break;
      case 1:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_1ac,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_1ac[0]);
        local_1b0 = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_1b0);
        puVar3 = addr_local;
        Dn::Dn(&local_1b4,(uint)local_30);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,local_1b4);
        StrWriter::operator<<(pSVar5);
        puVar3 = addr_local;
        Op<(moira::Mode)6,4>(&local_1cc,this,(ushort)local_2d,_old);
        StrWriter::operator<<((StrWriter *)puVar3,&local_1cc);
        break;
      case 2:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_1d4,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_1d4[0]);
        local_1d8 = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_1d8);
        puVar3 = addr_local;
        if ((uStack_2c & 0xff) == 0) {
          Imd::Imd(&local_1e0,0);
          StrWriter::operator<<((StrWriter *)puVar3,local_1e0);
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (ulong)(uStack_2c & 0xff) * 0x202020202 & 0x10884422010;
          FRegList::FRegList(&local_1da,(ushort)SUB161(auVar2 % ZEXT816(0x3ff),0));
          StrWriter::operator<<((StrWriter *)puVar3,local_1da);
        }
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Op<(moira::Mode)6,4>(&local_1f8,this,(ushort)local_2d,_old);
        StrWriter::operator<<(pSVar5,&local_1f8);
        break;
      case 3:
        pSVar5 = StrWriter::operator<<((StrWriter *)addr_local);
        Ffmt::Ffmt(local_200,2);
        pSVar5 = StrWriter::operator<<(pSVar5,local_200[0]);
        local_204 = addr_local[0xe];
        StrWriter::operator<<(pSVar5,(Tab)local_204);
        puVar3 = addr_local;
        Dn::Dn(&local_208,(uint)local_30);
        pSVar5 = StrWriter::operator<<((StrWriter *)puVar3,local_208);
        StrWriter::operator<<(pSVar5);
        puVar3 = addr_local;
        Op<(moira::Mode)6,4>(&local_220,this,(ushort)local_2d,_old);
        StrWriter::operator<<((StrWriter *)puVar3,&local_220);
      }
    }
  }
  else {
    *_old = _rrr;
    dasmIllegal<(moira::Instr)193,(moira::Mode)6,0>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmFMovem(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto mod = ___xx___________ (ext);
    auto rrr = _________xxx____ (ext);
    auto lll = ___xxx__________ (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b100: // Ea to Cntrl

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << "fmovel" << str.tab << Op<M, Long>(reg, addr) << Sep{};
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Op<M, Long>(reg, addr) << Sep{} << Fctrl{lll};
            break;

        case 0b101: // Cntrl to Ea

            if ((ext & 0x1C00) == 0) {

                if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

                    str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab << Sep{} << Op<M, Long>(reg, addr);
                    return;
                }
            }
            if (lll == 0 || lll == 1 || lll == 2 || lll == 4) {
                str << Ins<Instr::FMOVE>{} << Ffmt{0} << str.tab;
            } else {
                str << Ins<Instr::FMOVEM>{} << Ffmt{0} << str.tab;
            }
            str << Fctrl{lll} << Sep{} << Op<M, Long>(reg, addr);
            break;

        case 0b110: // Memory to FPU

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF));
                    } else {
                        str << Imd{0};
                    }
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Op<M, Long>(reg, addr) << Sep{};
                    str << Dn{rrr};
                    break;
            }
            break;

        case 0b111: // FPU to memory

            switch (mod) {

                case 0b00: // Static list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(ext & 0xFF);
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b01: // Dynamic list, predecrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;

                case 0b10: // Static list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    if (ext & 0xFF) {
                        str << FRegList(REVERSE_8(ext & 0xFF)) ;
                    } else {
                        str << Imd{0};
                    }
                    str << Sep{} << Op<M, Long>(reg, addr);
                    break;

                case 0b11: // Dynamic list, postincrement addressing

                    str << Ins<I>{} << Ffmt{2} << str.tab;
                    str << Dn{rrr} << Sep{};
                    str << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}